

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_reader.hpp
# Opt level: O3

ssize_t __thiscall
jsoncons::bson::basic_bson_reader<jsoncons::bytes_source,_std::allocator<char>_>::read
          (basic_bson_reader<jsoncons::bytes_source,_std::allocator<char>_> *this,int __fd,
          void *__buf,size_t __nbytes)

{
  ssize_t extraout_RAX;
  ser_error *this_00;
  undefined8 extraout_RAX_00;
  error_code ec_00;
  error_code ec;
  error_code local_20;
  
  local_20._M_value = 0;
  local_20._M_cat = (error_category *)std::_V2::system_category();
  basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::reset(&this->parser_);
  basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::parse
            (&this->parser_,this->visitor_,&local_20);
  if (local_20._M_value == 0) {
    return extraout_RAX;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  ec_00._4_4_ = 0;
  ec_00._M_value = local_20._M_value;
  ec_00._M_cat = local_20._M_cat;
  ser_error::ser_error
            (this_00,ec_00,0,
             (long)(this->parser_).source_.current_ - (long)(this->parser_).source_.data_);
  basic_bson_reader<jsoncons::bytes_source,std::allocator<char>>::read
            ((basic_bson_reader<jsoncons::bytes_source,std::allocator<char>> *)this_00);
  __cxa_free_exception(this_00);
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

void read()
    {
        std::error_code ec;
        read(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec,line(),column()));
        }
    }